

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

void __thiscall CMainParams::CMainParams(CMainParams *this)

{
  map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  *this_00;
  uint256 *puVar1;
  CBlock *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  undefined8 uVar2;
  pointer puVar3;
  pointer puVar4;
  void *pvVar5;
  base_blob<256U> *pbVar6;
  pointer puVar7;
  long lVar8;
  undefined8 *puVar9;
  CBlock *pCVar10;
  CAmount *in_R9;
  long in_FS_OFFSET;
  byte bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  initializer_list<std::pair<const_int,_uint256>_> __l;
  allocator_type local_241;
  undefined8 local_240;
  undefined1 local_238 [80];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_1e8;
  bool local_1d0;
  bool bStack_1cf;
  bool local_1ce;
  undefined1 local_58 [8];
  _Rb_tree_node_base _Stack_50;
  size_t local_30;
  long local_20;
  
  bVar11 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = MAIN;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar3 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  this_00 = &(this->super_CChainParams).consensus.script_flag_exceptions;
  local_238[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x22;
  local_238[1] = 0x9c;
  local_238[2] = 'O';
  local_238[3] = 0xac;
  local_238[4] = 0x88;
  local_238[5] = 0xba;
  local_238[6] = 0xb1;
  local_238[7] = 0x94;
  local_238[8] = 0xeb;
  local_238[9] = '\b';
  local_238[10] = 0xf1;
  local_238[0xb] = 0xa5;
  local_238[0xc] = '(';
  local_238[0xd] = 0xcc;
  local_238[0xe] = '0';
  local_238[0xf] = 0x8d;
  local_238[0x10] = 0xed;
  local_238[0x11] = '#';
  local_238[0x12] = 0x97;
  local_238[0x13] = 0xf4;
  local_238[0x14] = 0xf4;
  local_238[0x15] = 0xeb;
  local_238[0x16] = 'n';
  local_238[0x17] = 'u';
  local_238[0x18] = 0xdc;
  local_238[0x19] = '\x02';
  local_238[0x1a] = '\0';
  local_238[0x1b] = '\0';
  local_238[0x1c] = '\0';
  local_238[0x1d] = '\0';
  local_238[0x1e] = '\0';
  local_238[0x1f] = '\0';
  local_58._0_4_ = IPPROTO_IP;
  std::
  map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
  ::emplace<uint256,__0>
            ((map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
              *)this_00,(uint256 *)local_238,(anon_enum_32 *)local_58);
  local_238[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xad;
  local_238[1] = 0x95;
  local_238[2] = 0xe3;
  local_238[3] = 0xa1;
  local_238[4] = '^';
  local_238[5] = 0xe5;
  local_238[6] = 0xff;
  local_238[7] = 0xd5;
  local_238[8] = 0x85;
  local_238[9] = 0xc5;
  local_238[10] = 0xe8;
  local_238[0xb] = '\x1d';
  local_238[0xc] = 'D';
  local_238[0xd] = 0xb5;
  local_238[0xe] = 'j';
  local_238[0xf] = 0x98;
  local_238[0x10] = '\x1e';
  local_238[0x11] = 0x84;
  local_238[0x12] = '-';
  local_238[0x13] = '[';
  local_238[0x14] = 0xc3;
  local_238[0x15] = '\x14';
  local_238[0x16] = '\x0f';
  local_238[0x17] = '\0';
  local_238[0x18] = '\0';
  local_238[0x19] = '\0';
  local_238[0x1a] = '\0';
  local_238[0x1b] = '\0';
  local_238[0x1c] = '\0';
  local_238[0x1d] = '\0';
  local_238[0x1e] = '\0';
  local_238[0x1f] = '\0';
  local_58._0_4_ = 0x801;
  std::
  _Rb_tree<uint256,std::pair<uint256_const,unsigned_int>,std::_Select1st<std::pair<uint256_const,unsigned_int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
  ::_M_emplace_unique<uint256,unsigned_int>
            ((_Rb_tree<uint256,std::pair<uint256_const,unsigned_int>,std::_Select1st<std::pair<uint256_const,unsigned_int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
              *)this_00,(uint256 *)local_238,(uint *)local_58);
  (this->super_CChainParams).consensus.BIP34Height = 0x37a5b;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xb8;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x9c;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 'u';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 'j';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0xdd;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x15';
  pbVar6 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = 0x91;
  (pbVar6->m_data)._M_elems[9] = 0xb1;
  (pbVar6->m_data)._M_elems[10] = 0xd1;
  (pbVar6->m_data)._M_elems[0xb] = '{';
  (pbVar6->m_data)._M_elems[0xc] = 0xab;
  (pbVar6->m_data)._M_elems[0xd] = 'D';
  (pbVar6->m_data)._M_elems[0xe] = 0xbb;
  (pbVar6->m_data)._M_elems[0xf] = 0xa3;
  pbVar6 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = 0xfe;
  (pbVar6->m_data)._M_elems[0x11] = 0xd9;
  (pbVar6->m_data)._M_elems[0x12] = 0xe0;
  (pbVar6->m_data)._M_elems[0x13] = '/';
  (pbVar6->m_data)._M_elems[0x14] = 0x94;
  (pbVar6->m_data)._M_elems[0x15] = '*';
  (pbVar6->m_data)._M_elems[0x16] = 0xb4;
  (pbVar6->m_data)._M_elems[0x17] = 0x89;
  (this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>.m_data._M_elems[0x18] = 'K';
  (this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       '\x02';
  pbVar6 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  pbVar6 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 0x5ed1d;
  (this->super_CChainParams).consensus.BIP66Height = 0x58ccd;
  (this->super_CChainParams).consensus.CSVHeight = 0x66600;
  (this->super_CChainParams).consensus.SegwitHeight = 0x75a20;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0x76200;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[4] = 0xff;
  (pbVar6->m_data)._M_elems[5] = 0xff;
  (pbVar6->m_data)._M_elems[6] = 0xff;
  (pbVar6->m_data)._M_elems[7] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = 0xff;
  (pbVar6->m_data)._M_elems[9] = 0xff;
  (pbVar6->m_data)._M_elems[10] = 0xff;
  (pbVar6->m_data)._M_elems[0xb] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0xc] = 0xff;
  (pbVar6->m_data)._M_elems[0xd] = 0xff;
  (pbVar6->m_data)._M_elems[0xe] = 0xff;
  (pbVar6->m_data)._M_elems[0xf] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0xc] = 0xff;
  (pbVar6->m_data)._M_elems[0xd] = 0xff;
  (pbVar6->m_data)._M_elems[0xe] = 0xff;
  (pbVar6->m_data)._M_elems[0xf] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = 0xff;
  (pbVar6->m_data)._M_elems[0x11] = 0xff;
  (pbVar6->m_data)._M_elems[0x12] = 0xff;
  (pbVar6->m_data)._M_elems[0x13] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x14] = 0xff;
  (pbVar6->m_data)._M_elems[0x15] = 0xff;
  (pbVar6->m_data)._M_elems[0x16] = 0xff;
  (pbVar6->m_data)._M_elems[0x17] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x18] = 0xff;
  (pbVar6->m_data)._M_elems[0x19] = 0xff;
  (pbVar6->m_data)._M_elems[0x1a] = 0xff;
  (pbVar6->m_data)._M_elems[0x1b] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  (this->super_CChainParams).consensus.fPowAllowMinDifficultyBlocks = false;
  (this->super_CChainParams).consensus.enforce_BIP94 = false;
  (this->super_CChainParams).consensus.fPowNoRetargeting = false;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x717;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = 0x60835f80;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x61131300;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0xad400;
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xd6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 'D';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xec;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x93;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 0xc1;
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 'b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x0e';
  pbVar6 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = 0xb7;
  (pbVar6->m_data)._M_elems[9] = 0x86;
  (pbVar6->m_data)._M_elems[10] = 0xe1;
  (pbVar6->m_data)._M_elems[0xb] = 0x88;
  pbVar6 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  pbVar6 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0xc] = '\0';
  (pbVar6->m_data)._M_elems[0xd] = '\0';
  (pbVar6->m_data)._M_elems[0xe] = '\0';
  (pbVar6->m_data)._M_elems[0xf] = '\0';
  (pbVar6->m_data)._M_elems[0x10] = '\0';
  (pbVar6->m_data)._M_elems[0x11] = '\0';
  (pbVar6->m_data)._M_elems[0x12] = '\0';
  (pbVar6->m_data)._M_elems[0x13] = '\0';
  (pbVar6->m_data)._M_elems[0x14] = '\0';
  (pbVar6->m_data)._M_elems[0x15] = '\0';
  (pbVar6->m_data)._M_elems[0x16] = '\0';
  (pbVar6->m_data)._M_elems[0x17] = '\0';
  (pbVar6->m_data)._M_elems[0x18] = '\0';
  (pbVar6->m_data)._M_elems[0x19] = '\0';
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '?';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '&';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 'W';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\x1a';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 'O';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xef;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0xca;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 0x9a;
  pbVar6 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = 'X';
  (pbVar6->m_data)._M_elems[9] = 'W';
  (pbVar6->m_data)._M_elems[10] = '\0';
  (pbVar6->m_data)._M_elems[0xb] = 0xce;
  (pbVar6->m_data)._M_elems[0xc] = 0x97;
  (pbVar6->m_data)._M_elems[0xd] = '[';
  (pbVar6->m_data)._M_elems[0xe] = 0xd2;
  (pbVar6->m_data)._M_elems[0xf] = 0xe5;
  pbVar6 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = 0xdb;
  (pbVar6->m_data)._M_elems[0x11] = '[';
  (pbVar6->m_data)._M_elems[0x12] = '6';
  (pbVar6->m_data)._M_elems[0x13] = 0x90;
  pbVar6 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x14] = 'X';
  (pbVar6->m_data)._M_elems[0x15] = '\x1c';
  (this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
  [0x16] = '\x01';
  (this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
  [0x1f] = '\0';
  pbVar6 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x17] = '\0';
  (pbVar6->m_data)._M_elems[0x18] = '\0';
  (pbVar6->m_data)._M_elems[0x19] = '\0';
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0xd9b4bef9;
  (this->super_CChainParams).nDefaultPort = 0x208d;
  (this->super_CChainParams).nPruneAfterHeight = 100000;
  (this->super_CChainParams).m_assumed_blockchain_size = 0x26c;
  (this->super_CChainParams).m_assumed_chain_state_size = 0xe;
  local_240 = 5000000000;
  CreateGenesisBlock((CBlock *)local_238,0x495fab29,0x7c2bac1d,0x1d00ffff,(int32_t)&local_240,in_R9)
  ;
  this_01 = &(this->super_CChainParams).genesis;
  puVar9 = (undefined8 *)local_238;
  pCVar10 = this_01;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar2 = *puVar9;
    (pCVar10->super_CBlockHeader).nVersion = (int)uVar2;
    (pCVar10->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar2 >> 0x20);
    (pCVar10->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar2 >> 0x28);
    (pCVar10->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar2 >> 0x30);
    (pCVar10->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar2 >> 0x38);
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    pCVar10 = (CBlock *)((long)pCVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  _Stack_50._M_parent =
       (_Base_ptr)
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1e8.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58 = (undefined1  [8])
             (this->super_CChainParams).genesis.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  _Stack_50._0_8_ =
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1e8.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1e8.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_58);
  (this->super_CChainParams).genesis.m_checked_merkle_root = local_1ce;
  (this->super_CChainParams).genesis.fChecked = local_1d0;
  (this->super_CChainParams).genesis.m_checked_witness_commitment = bStack_1cf;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_1e8);
  CBlockHeader::GetHash((uint256 *)local_238,&this_01->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) =
       CONCAT17(local_238[0x17],
                CONCAT16(local_238[0x16],
                         CONCAT15(local_238[0x15],
                                  CONCAT14(local_238[0x14],
                                           CONCAT13(local_238[0x13],
                                                    CONCAT12(local_238[0x12],
                                                             CONCAT11(local_238[0x11],
                                                                      local_238[0x10])))))));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) =
       CONCAT17(local_238[0x1f],
                CONCAT16(local_238[0x1e],
                         CONCAT15(local_238[0x1d],
                                  CONCAT14(local_238[0x1c],
                                           CONCAT13(local_238[0x1b],
                                                    CONCAT12(local_238[0x1a],
                                                             CONCAT11(local_238[0x19],
                                                                      local_238[0x18])))))));
  *(ulong *)(this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
            _M_elems =
       CONCAT17(local_238[7],
                CONCAT16(local_238[6],
                         CONCAT15(local_238[5],
                                  CONCAT14(local_238[4],
                                           CONCAT13(local_238[3],
                                                    CONCAT12(local_238[2],
                                                             CONCAT11(local_238[1],local_238[0])))))
                        ));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) =
       CONCAT17(local_238[0xf],
                CONCAT16(local_238[0xe],
                         CONCAT15(local_238[0xd],
                                  CONCAT14(local_238[0xc],
                                           CONCAT13(local_238[0xb],
                                                    CONCAT12(local_238[10],
                                                             CONCAT11(local_238[9],local_238[8])))))
                        ));
  local_238[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x6f;
  local_238[1] = 0xe2;
  local_238[2] = 0x8c;
  local_238[3] = '\n';
  local_238[4] = 0xb6;
  local_238[5] = 0xf1;
  local_238[6] = 0xb3;
  local_238[7] = 'r';
  local_238[8] = 0xc1;
  local_238[9] = 0xa6;
  local_238[10] = 0xa2;
  local_238[0xb] = 'F';
  local_238[0xc] = 0xae;
  local_238[0xd] = 'c';
  local_238[0xe] = 0xf7;
  local_238[0xf] = 'O';
  local_238[0x10] = 0x93;
  local_238[0x11] = '\x1e';
  local_238[0x12] = 0x83;
  local_238[0x13] = 'e';
  local_238[0x14] = 0xe1;
  local_238[0x15] = 'Z';
  local_238[0x16] = '\b';
  local_238[0x17] = 0x9c;
  local_238[0x18] = 'h';
  local_238[0x19] = 0xd6;
  local_238[0x1a] = '\x19';
  local_238[0x1b] = '\0';
  local_238[0x1c] = '\0';
  local_238[0x1d] = '\0';
  local_238[0x1e] = '\0';
  local_238[0x1f] = '\0';
  auVar13[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x10] == 0x93);
  auVar13[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x11] == '\x1e');
  auVar13[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x12] == 0x83);
  auVar13[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x13] == 'e');
  auVar13[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x14] == 0xe1);
  auVar13[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x15] == 'Z');
  auVar13[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x16] == '\b');
  auVar13[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x17] == 0x9c);
  auVar13[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x18] == 'h');
  auVar13[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x19] == 0xd6);
  auVar13[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == '\x19');
  auVar13[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1b] == '\0');
  auVar13[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1c] == '\0');
  auVar13[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1d] == '\0');
  auVar13[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1e] == '\0');
  auVar13[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1f] == '\0');
  auVar12[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0] == 'o');
  auVar12[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[1] == 0xe2);
  auVar12[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[2] == 0x8c);
  auVar12[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[3] == '\n');
  auVar12[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[4] == 0xb6);
  auVar12[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[5] == 0xf1);
  auVar12[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[6] == 0xb3);
  auVar12[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[7] == 'r');
  auVar12[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[8] == 0xc1);
  auVar12[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[9] == 0xa6);
  auVar12[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[10] == 0xa2);
  auVar12[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xb] == 'F');
  auVar12[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xc] == 0xae);
  auVar12[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xd] == 'c');
  auVar12[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xe] == 0xf7);
  auVar12[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xf] == 'O');
  auVar13 = auVar13 & auVar12;
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"000000000019d6689c085ae165831e934ff763ae46a2a6c172b3f1b60a8ce26f\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x8b,"CMainParams::CMainParams()");
  }
  local_238[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x3b;
  local_238[1] = 0xa3;
  local_238[2] = 0xed;
  local_238[3] = 0xfd;
  local_238[4] = 'z';
  local_238[5] = '{';
  local_238[6] = '\x12';
  local_238[7] = 0xb2;
  local_238[8] = 'z';
  local_238[9] = 199;
  local_238[10] = ',';
  local_238[0xb] = '>';
  local_238[0xc] = 'g';
  local_238[0xd] = 'v';
  local_238[0xe] = 0x8f;
  local_238[0xf] = 'a';
  local_238[0x10] = '\x7f';
  local_238[0x11] = 200;
  local_238[0x12] = '\x1b';
  local_238[0x13] = 0xc3;
  local_238[0x14] = 0x88;
  local_238[0x15] = 0x8a;
  local_238[0x16] = 'Q';
  local_238[0x17] = '2';
  local_238[0x18] = ':';
  local_238[0x19] = 0x9f;
  local_238[0x1a] = 0xb8;
  local_238[0x1b] = 0xaa;
  local_238[0x1c] = 'K';
  local_238[0x1d] = '\x1e';
  local_238[0x1e] = '^';
  local_238[0x1f] = 'J';
  auVar15[0] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) ==
                '\x7f');
  auVar15[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x11) ==
                200);
  auVar15[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x12) ==
                '\x1b');
  auVar15[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x13) ==
                0xc3);
  auVar15[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14) ==
                0x88);
  auVar15[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x15) ==
                0x8a);
  auVar15[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x16) ==
                'Q');
  auVar15[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x17) ==
                '2');
  auVar15[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) ==
                ':');
  auVar15[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x19) ==
                0x9f);
  auVar15[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1a) ==
                 0xb8);
  auVar15[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1b) ==
                  0xaa);
  auVar15[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) ==
                  'K');
  auVar15[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1d) ==
                  '\x1e');
  auVar15[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1e) ==
                  '^');
  auVar15[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1f) ==
                  'J');
  auVar14[0] = -((this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                 super_base_blob<256U>.m_data._M_elems[0] == ';');
  auVar14[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 1) == 0xa3)
  ;
  auVar14[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 2) == 0xed)
  ;
  auVar14[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 3) == 0xfd)
  ;
  auVar14[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 4) == 'z');
  auVar14[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 5) == '{');
  auVar14[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 6) ==
                '\x12');
  auVar14[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 7) == 0xb2)
  ;
  auVar14[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) == 'z');
  auVar14[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 9) == 199);
  auVar14[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 10) == ','
                 );
  auVar14[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xb) ==
                  '>');
  auVar14[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) ==
                  'g');
  auVar14[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xd) ==
                  'v');
  auVar14[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xe) ==
                  0x8f);
  auVar14[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xf) ==
                  'a');
  auVar14 = auVar14 & auVar15;
  if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x8c,"CMainParams::CMainParams()");
  }
  this_02 = &(this->super_CChainParams).vSeeds;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [22])"seed.bitcoin.sipa.be.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [21])"dnsseed.bluematt.me.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[45]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [45])"dnsseed.bitcoin.dashjr-list-of-p2p-nodes.us.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[31]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [31])0x87d3ec);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [24])"seed.btc.petertodd.net.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[27]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [27])"seed.bitcoin.sprovoost.nl.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [17])"dnsseed.emzy.de.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [22])"seed.bitcoin.wiz.biz.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [29])"seed.mainnet.achownodes.xyz.");
  puVar7 = (pointer)operator_new(1);
  *puVar7 = '\0';
  puVar3 = (this->super_CChainParams).base58Prefixes[0].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->super_CChainParams).base58Prefixes[0].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar7;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar7 + 1;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar7 + 1;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  puVar7 = (pointer)operator_new(1);
  *puVar7 = '\x05';
  puVar3 = (this->super_CChainParams).base58Prefixes[1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->super_CChainParams).base58Prefixes[1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar7;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar7 + 1;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar7 + 1;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  puVar7 = (pointer)operator_new(1);
  *puVar7 = 0x80;
  puVar3 = (this->super_CChainParams).base58Prefixes[2].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->super_CChainParams).base58Prefixes[2].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar7;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar7 + 1;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar7 + 1;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  local_238[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x4;
  local_238[1] = 0x88;
  local_238[2] = 0xb2;
  local_238[3] = '\x1e';
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_238);
  local_238[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x4;
  local_238[1] = 0x88;
  local_238[2] = 0xad;
  local_238[3] = 0xe4;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->super_CChainParams).bech32_hrp,0,
             (this->super_CChainParams).bech32_hrp._M_string_length,"bc",2);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_238,chainparams_seed_main,
             "g+",(allocator_type *)local_58);
  puVar3 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT17(local_238[7],
                               CONCAT16(local_238[6],
                                        CONCAT15(local_238[5],
                                                 CONCAT14(local_238[4],
                                                          CONCAT13(local_238[3],
                                                                   CONCAT12(local_238[2],
                                                                            CONCAT11(local_238[1],
                                                                                     local_238[0])))
                                                         ))));
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT17(local_238[0xf],
                                CONCAT16(local_238[0xe],
                                         CONCAT15(local_238[0xd],
                                                  CONCAT14(local_238[0xc],
                                                           CONCAT13(local_238[0xb],
                                                                    CONCAT12(local_238[10],
                                                                             CONCAT11(local_238[9],
                                                                                      local_238[8]))
                                                                   )))));
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT17(local_238[0x17],
                         CONCAT16(local_238[0x16],
                                  CONCAT15(local_238[0x15],
                                           CONCAT14(local_238[0x14],
                                                    CONCAT13(local_238[0x13],
                                                             CONCAT12(local_238[0x12],
                                                                      CONCAT11(local_238[0x11],
                                                                               local_238[0x10]))))))
                        );
  local_238[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x0;
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = '\0';
  local_238[0xb] = '\0';
  local_238[0xc] = '\0';
  local_238[0xd] = '\0';
  local_238[0xe] = '\0';
  local_238[0xf] = '\0';
  local_238[0x10] = '\0';
  local_238[0x11] = '\0';
  local_238[0x12] = '\0';
  local_238[0x13] = '\0';
  local_238[0x14] = '\0';
  local_238[0x15] = '\0';
  local_238[0x16] = '\0';
  local_238[0x17] = '\0';
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
    pvVar5 = (void *)CONCAT17(local_238[7],
                              CONCAT16(local_238[6],
                                       CONCAT15(local_238[5],
                                                CONCAT14(local_238[4],
                                                         CONCAT13(local_238[3],
                                                                  CONCAT12(local_238[2],
                                                                           CONCAT11(local_238[1],
                                                                                    local_238[0]))))
                                               )));
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,CONCAT17(local_238[0x17],
                                      CONCAT16(local_238[0x16],
                                               CONCAT15(local_238[0x15],
                                                        CONCAT14(local_238[0x14],
                                                                 CONCAT13(local_238[0x13],
                                                                          CONCAT12(local_238[0x12],
                                                                                   CONCAT11(
                                                  local_238[0x11],local_238[0x10]))))))) -
                             (long)pvVar5);
    }
  }
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  memcpy((iterator)local_238,&DAT_00889f70,0x1d4);
  __l._M_len = 0xd;
  __l._M_array = (iterator)local_238;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             local_58,__l,(less<int> *)&local_240,&local_241);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
           *)&(this->super_CChainParams).checkpointData);
  if (_Stack_50._M_parent != (_Base_ptr)0x0) {
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = _Stack_50._M_color;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = _Stack_50._M_parent;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) = _Stack_50._M_left;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) = _Stack_50._M_right;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_50._M_parent)->_M_parent)->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
          super__Rb_tree_header;
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_30;
    _Stack_50._M_parent = (_Base_ptr)0x0;
    local_30 = 0;
    _Stack_50._M_left = &_Stack_50;
    _Stack_50._M_right = &_Stack_50;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_58);
  local_238[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x40;
  local_238[1] = 0xd1;
  local_238[2] = '\f';
  local_238[3] = '\0';
  local_238[4] = 0x96;
  local_238[5] = 0x8f;
  local_238[6] = 'v';
  local_238[7] = '\x10';
  local_238[8] = 's';
  local_238[9] = 'h';
  local_238[10] = 'w';
  local_238[0xb] = 0x8f;
  local_238[0xc] = ' ';
  local_238[0xd] = 0x82;
  local_238[0xe] = '#';
  local_238[0xf] = 0x9e;
  local_238[0x10] = '\x7f';
  local_238[0x11] = 'Q';
  local_238[0x12] = '\x1a';
  local_238[0x13] = '\x17';
  local_238[0x14] = 0xb7;
  local_238[0x15] = 0xab;
  local_238[0x16] = 0xcc;
  local_238[0x17] = 0x8e;
  local_238[0x18] = '^';
  local_238[0x19] = 0x8e;
  local_238[0x1a] = 0x81;
  local_238[0x1b] = 'g';
  local_238[0x1c] = '_';
  local_238[0x1d] = 0xb6;
  local_238[0x1e] = 'Z';
  local_238[0x1f] = '\x1b';
  local_238[0x20] = '\x1b';
  local_238[0x21] = 'R';
  local_238[0x22] = 0xa5;
  local_238[0x23] = 0xa2;
  local_238[0x28] = 0x82;
  local_238[0x29] = 0xf3;
  local_238[0x2a] = '\x11';
  local_238[0x2b] = ';';
  local_238[0x2c] = '\0';
  local_238[0x2d] = '\0';
  local_238[0x2e] = '\0';
  local_238[0x2f] = '\0';
  local_238[0x30] = 0xa5;
  local_238[0x31] = 0x83;
  local_238[0x32] = 0xda;
  local_238[0x33] = '\x1c';
  local_238[0x34] = '?';
  local_238[0x35] = 0xf2;
  local_238[0x36] = 0x9b;
  local_238[0x37] = 'h';
  local_238[0x38] = 'r';
  local_238[0x39] = 'H';
  local_238[0x3a] = 0xff;
  local_238[0x3b] = 's';
  local_238[0x3c] = 'x';
  local_238[0x3d] = '\"';
  local_238[0x3e] = 0xf8;
  local_238[0x3f] = 0xce;
  local_238[0x40] = 'H';
  local_238[0x41] = '\'';
  local_238[0x42] = '\x03';
  local_238[0x43] = ':';
  local_238._68_2_ = 0x2028;
  local_238[0x46] = 3;
  local_238._71_8_ = 0;
  local_238[0x4f] = 0;
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,local_238);
  (this->super_CChainParams).chainTxData.nTime = 0x66bccc78;
  (this->super_CChainParams).chainTxData.tx_count = 0x3f23d4b5;
  (this->super_CChainParams).chainTxData.dTxRate = 6.721086701157182;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CMainParams() {
        m_chain_type = ChainType::MAIN;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.script_flag_exceptions.emplace( // BIP16 exception
            uint256{"00000000000002dc756eebf4f49723ed8d30cc28a5f108eb94b1ba88ac4f9c22"}, SCRIPT_VERIFY_NONE);
        consensus.script_flag_exceptions.emplace( // Taproot exception
            uint256{"0000000000000000000f14c35b2d841e986ab5441de8c585d5ffe55ea1e395ad"}, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS);
        consensus.BIP34Height = 227931;
        consensus.BIP34Hash = uint256{"000000000000024b89b42a942fe0d9fea3bb44ab7bd1b19115dd6a759c0808b8"};
        consensus.BIP65Height = 388381; // 000000000000000004c2b624ed5d7756c508d90fd0da2c7c679febfa6c4735f0
        consensus.BIP66Height = 363725; // 00000000000000000379eaa19dce8c9b722d46ae6a57c2f1a988119488b50931
        consensus.CSVHeight = 419328; // 000000000000000004a1b34462cb8aeebd5799177f7a29cf28f2d1961716b5b5
        consensus.SegwitHeight = 481824; // 0000000000000000001c8018d9cb3b742ef25114f27563e3fc4a1902167f9893
        consensus.MinBIP9WarningHeight = 483840; // segwit activation height + miner confirmation window
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = false;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1815; // 90% of 2016
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = 1619222400; // April 24th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = 1628640000; // August 11th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 709632; // Approximately November 12th, 2021

        consensus.nMinimumChainWork = uint256{"000000000000000000000000000000000000000088e186b70e0862c193ec44d6"};
        consensus.defaultAssumeValid = uint256{"000000000000000000011c5890365bdbe5d25b97ce0057589acaef4f1a57263f"}; // 856760

        /**
         * The message start string is designed to be unlikely to occur in normal data.
         * The characters are rarely used upper ASCII, not valid as UTF-8, and produce
         * a large 32-bit integer with any alignment.
         */
        pchMessageStart[0] = 0xf9;
        pchMessageStart[1] = 0xbe;
        pchMessageStart[2] = 0xb4;
        pchMessageStart[3] = 0xd9;
        nDefaultPort = 8333;
        nPruneAfterHeight = 100000;
        m_assumed_blockchain_size = 620;
        m_assumed_chain_state_size = 14;

        genesis = CreateGenesisBlock(1231006505, 2083236893, 0x1d00ffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"000000000019d6689c085ae165831e934ff763ae46a2a6c172b3f1b60a8ce26f"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        // Note that of those which support the service bits prefix, most only support a subset of
        // possible options.
        // This is fine at runtime as we'll fall back to using them as an addrfetch if they don't support the
        // service bits we want, but we should get them updated to support all service bits wanted by any
        // release ASAP to avoid it where possible.
        vSeeds.emplace_back("seed.bitcoin.sipa.be."); // Pieter Wuille, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("dnsseed.bluematt.me."); // Matt Corallo, only supports x9
        vSeeds.emplace_back("dnsseed.bitcoin.dashjr-list-of-p2p-nodes.us."); // Luke Dashjr
        vSeeds.emplace_back("seed.bitcoin.jonasschnelli.ch."); // Jonas Schnelli, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("seed.btc.petertodd.net."); // Peter Todd, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("seed.bitcoin.sprovoost.nl."); // Sjors Provoost
        vSeeds.emplace_back("dnsseed.emzy.de."); // Stephan Oeste
        vSeeds.emplace_back("seed.bitcoin.wiz.biz."); // Jason Maurice
        vSeeds.emplace_back("seed.mainnet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,0);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,5);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,128);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x88, 0xB2, 0x1E};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x88, 0xAD, 0xE4};

        bech32_hrp = "bc";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_main), std::end(chainparams_seed_main));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                { 11111, uint256{"0000000069e244f73d78e8fd29ba2fd2ed618bd6fa2ee92559f542fdb26e7c1d"}},
                { 33333, uint256{"000000002dd5588a74784eaa7ab0507a18ad16a236e7b1ce69f00d7ddfb5d0a6"}},
                { 74000, uint256{"0000000000573993a3c9e41ce34471c079dcf5f52a0e824a81e7f953b8661a20"}},
                {105000, uint256{"00000000000291ce28027faea320c8d2b054b2e0fe44a773f3eefb151d6bdc97"}},
                {134444, uint256{"00000000000005b12ffd4cd315cd34ffd4a594f430ac814c91184a0d42d2b0fe"}},
                {168000, uint256{"000000000000099e61ea72015e79632f216fe6cb33d7899acb35b75c8303b763"}},
                {193000, uint256{"000000000000059f452a5f7340de6682a977387c17010ff6e6c3bd83ca8b1317"}},
                {210000, uint256{"000000000000048b95347e83192f69cf0366076336c639f9b7228e9ba171342e"}},
                {216116, uint256{"00000000000001b4f4b433e81ee46494af945cf96014816a4e2370f11b23df4e"}},
                {225430, uint256{"00000000000001c108384350f74090433e7fcf79a606b8e797f065b130575932"}},
                {250000, uint256{"000000000000003887df1f29024b06fc2200b55f8af8f35453d7be294df2d214"}},
                {279000, uint256{"0000000000000001ae8c72a0b0c301f67e3afca10e819efa9041e458e9bd7e40"}},
                {295000, uint256{"00000000000000004d9b4ef50f0f9d686fd69db2e03af35a100370c64632a983"}},
            }
        };

        m_assumeutxo_data = {
            {
                .height = 840'000,
                .hash_serialized = AssumeutxoHash{uint256{"a2a5521b1b5ab65f67818e5e8eccabb7171a517f9e2382208f77687310768f96"}},
                .m_chain_tx_count = 991032194,
                .blockhash = consteval_ctor(uint256{"0000000000000000000320283a032748cef8227873ff4872689bf23f1cda83a5"}),
            }
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000000000000000011c5890365bdbe5d25b97ce0057589acaef4f1a57263f
            .nTime    = 1723649144,
            .tx_count = 1059312821,
            .dTxRate  = 6.721086701157182,
        };
    }